

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

qpdf_offset_t __thiscall QPDF::maxEnd(QPDF *this,ObjUser *ou)

{
  bool bVar1;
  pointer pMVar2;
  size_type sVar3;
  mapped_type *this_00;
  size_type sVar4;
  mapped_type *pmVar5;
  longlong *plVar6;
  allocator<char> local_99;
  string local_98;
  key_type *local_78;
  QPDFObjGen *og;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  qpdf_offset_t end;
  allocator<char> local_39;
  string local_38;
  key_type *local_18;
  ObjUser *ou_local;
  QPDF *this_local;
  
  local_18 = ou;
  ou_local = (ObjUser *)this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  sVar3 = std::
          map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
          ::count(&pMVar2->obj_user_to_objects,local_18);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"no entry in object user table for requested object user",
               &local_39);
    stopOnError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  __range1 = (mapped_type *)0x0;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  this_00 = std::
            map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
            ::operator[](&pMVar2->obj_user_to_objects,local_18);
  __end1 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::begin(this_00);
  og = (QPDFObjGen *)
       std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&og);
    if (!bVar1) break;
    local_78 = std::_Rb_tree_const_iterator<QPDFObjGen>::operator*(&__end1);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar4 = std::
            map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
            ::count(&pMVar2->obj_cache,local_78);
    if (sVar4 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"unknown object referenced in object user table",&local_99);
      stopOnError(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pmVar5 = std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::operator[](&pMVar2->obj_cache,local_78);
    plVar6 = std::max<long_long>((longlong *)&__range1,&pmVar5->end_after_space);
    __range1 = (mapped_type *)*plVar6;
    std::_Rb_tree_const_iterator<QPDFObjGen>::operator++(&__end1);
  }
  return (qpdf_offset_t)__range1;
}

Assistant:

qpdf_offset_t
QPDF::maxEnd(ObjUser const& ou)
{
    if (m->obj_user_to_objects.count(ou) == 0) {
        stopOnError("no entry in object user table for requested object user");
    }
    qpdf_offset_t end = 0;
    for (auto const& og: m->obj_user_to_objects[ou]) {
        if (!m->obj_cache.count(og)) {
            stopOnError("unknown object referenced in object user table");
        }
        end = std::max(end, m->obj_cache[og].end_after_space);
    }
    return end;
}